

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_lazy_or_inplace
               (roaring_bitmap_t *x1,roaring_bitmap_t *x2,_Bool bitsetconversion)

{
  uint8_t type;
  int iVar1;
  uint8_t uVar2;
  container_t *c;
  array_container_t *sc;
  ulong uVar3;
  array_container_t *paVar4;
  ulong uVar5;
  int32_t start_index;
  undefined7 in_register_00000011;
  long lVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  container_t *old_c1;
  int iVar11;
  roaring_array_t *ra;
  uint8_t old_type1;
  bool bVar12;
  uint8_t type1;
  uint8_t type2;
  uint8_t result_type;
  uint8_t local_7f;
  uint8_t local_7e;
  uint8_t local_7d;
  uint16_t local_7c;
  uint16_t local_7a;
  ulong local_78;
  array_container_t *local_70;
  roaring_array_t *local_68;
  ulong local_60;
  int local_58;
  undefined4 local_54;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  local_7d = '\0';
  local_58 = (x2->high_low_container).size;
  if (local_58 == 0) {
    return;
  }
  uVar7 = (x1->high_low_container).size;
  if (uVar7 == 0) {
    roaring_bitmap_overwrite(x1,x2);
    return;
  }
  local_54 = (undefined4)CONCAT71(in_register_00000011,bitsetconversion);
  local_7a = *(x1->high_low_container).keys;
  local_7c = *(x2->high_low_container).keys;
  local_50 = (ulong)(uint)-local_58;
  uVar5 = 0;
  uVar3 = 0;
  local_68 = &x1->high_low_container;
  do {
    local_60 = (ulong)uVar7;
    local_78 = uVar5 & 0xffffffff;
    iVar11 = (int)local_50 + (int)uVar5;
    local_70 = (array_container_t *)(long)(int)uVar5;
    local_38 = (long)local_70 * 8;
    uVar10 = uVar3 & 0xffffffff;
    lVar6 = 0;
    local_40 = uVar5;
    while( true ) {
      ra = local_68;
      uVar5 = local_78 + lVar6;
      iVar9 = (int)uVar3;
      iVar1 = (int)lVar6;
      if (local_7a == local_7c) break;
      if (local_7a < local_7c) {
        uVar3 = uVar10 + lVar6 + 1;
        iVar8 = (int)local_60;
        if (iVar8 + iVar1 == (int)uVar3) {
          start_index = (int)local_78 + iVar1;
          goto LAB_0010764b;
        }
        local_7a = local_68->keys[uVar3 & 0xffff];
        uVar5 = (ulong)(uint)((int)local_78 + iVar1);
        goto LAB_001075c2;
      }
      uVar5 = uVar5 & 0xffff;
      local_7e = (x2->high_low_container).typecodes[uVar5];
      c = get_copy_of_container
                    ((x2->high_low_container).containers[uVar5],&local_7e,
                     (_Bool)((x2->high_low_container).flags & 1));
      if (((x2->high_low_container).flags & 1) != 0) {
        *(container_t **)((long)(x2->high_low_container).containers + lVar6 * 8 + local_38) = c;
        ((x2->high_low_container).typecodes + (long)local_70)[lVar6] = local_7e;
      }
      ra_insert_new_key_value_at(local_68,iVar9 + iVar1,local_7c,c,local_7e);
      if (iVar11 + iVar1 != -1) {
        local_7c = (x2->high_low_container).keys[(ushort)((short)local_78 + (short)lVar6 + 1)];
      }
      lVar6 = lVar6 + 1;
      iVar8 = (int)lVar6;
      if (iVar8 + iVar11 == 0) {
        start_index = (int)local_40 + iVar8;
        iVar9 = iVar9 + iVar8;
        iVar8 = (int)local_60 + iVar8;
        ra = local_68;
        goto LAB_001075e4;
      }
    }
    uVar7 = iVar9 + iVar1 & 0xffff;
    type = local_68->typecodes[uVar7];
    sc = (array_container_t *)local_68->containers[uVar7];
    paVar4 = sc;
    uVar2 = type;
    if (type == '\x04') {
      uVar2 = *(uint8_t *)&sc->array;
      paVar4 = *(array_container_t **)sc;
    }
    local_7f = type;
    if (uVar2 == '\x03') {
      if ((paVar4->cardinality == 1) && (*paVar4->array == 0)) {
        bVar12 = paVar4->array[1] == 0xffff;
        goto LAB_001073f6;
      }
LAB_00107401:
      local_48 = uVar10;
      if ((char)local_54 == '\0') {
LAB_00107422:
        if (type == '\x04') {
          sc = (array_container_t *)
               shared_container_extract_copy((shared_container_t *)sc,&local_7f);
        }
      }
      else {
        uVar2 = type;
        if (type == '\x04') {
          uVar2 = *(uint8_t *)&sc->array;
        }
        if (uVar2 == '\x01') goto LAB_00107422;
        paVar4 = sc;
        if (type == '\x04') {
          local_7f = *(uint8_t *)&sc->array;
          paVar4 = *(array_container_t **)sc;
        }
        if (local_7f != '\x01') {
          if (local_7f == '\x03') {
            paVar4 = (array_container_t *)bitset_container_from_run((run_container_t *)paVar4);
          }
          else {
            paVar4 = (array_container_t *)bitset_container_from_array(paVar4);
          }
        }
        local_70 = paVar4;
        container_free(sc,type);
        local_7f = '\x01';
        sc = local_70;
      }
      uVar5 = uVar5 & 0xffff;
      local_7e = (x2->high_low_container).typecodes[uVar5];
      paVar4 = (array_container_t *)
               container_lazy_ior(sc,local_7f,(x2->high_low_container).containers[uVar5],local_7e,
                                  &local_7d);
      if (paVar4 != sc) {
        container_free(sc,local_7f);
      }
      ra->containers[(int)local_48 + lVar6] = paVar4;
      ra->typecodes[lVar6 + (int)local_48] = local_7d;
      uVar10 = local_48;
    }
    else {
      bVar12 = paVar4->cardinality == 0x10000;
LAB_001073f6:
      if (!bVar12) goto LAB_00107401;
    }
    iVar8 = (int)local_60;
    uVar3 = uVar10 + lVar6 + 1;
    uVar5 = local_78 + 1 + lVar6;
    if ((int)local_78 + (int)local_50 + iVar1 == -1 || iVar8 + iVar1 == (uint)uVar3) {
      start_index = (int)local_78 + iVar1 + 1;
      iVar9 = (int)uVar10;
LAB_0010764b:
      iVar9 = iVar9 + iVar1 + 1;
      iVar8 = iVar8 + iVar1;
LAB_001075e4:
      if (iVar9 != iVar8) {
        return;
      }
      ra_append_copy_range
                (ra,&x2->high_low_container,start_index,local_58,
                 (_Bool)((x2->high_low_container).flags & 1));
      return;
    }
    local_7a = ra->keys[(uint)uVar3 & 0xffff];
    local_7c = (x2->high_low_container).keys[(uint)uVar5 & 0xffff];
LAB_001075c2:
    uVar7 = iVar8 + iVar1;
  } while( true );
}

Assistant:

void roaring_bitmap_lazy_or_inplace(roaring_bitmap_t *x1,
                                    const roaring_bitmap_t *x2,
                                    const bool bitsetconversion) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            if (!container_is_full(c1, type1)) {
                if ((bitsetconversion == false) ||
                    (get_container_type(c1, type1) == BITSET_CONTAINER_TYPE)) {
                    c1 = get_writable_copy_if_shared(c1, &type1);
                } else {
                    // convert to bitset
                    container_t *old_c1 = c1;
                    uint8_t old_type1 = type1;
                    c1 = container_mutable_unwrap_shared(c1, &type1);
                    c1 = container_to_bitset(c1, type1);
                    container_free(old_c1, old_type1);
                    type1 = BITSET_CONTAINER_TYPE;
                }

                container_t *c2 = ra_get_container_at_index(
                    &x2->high_low_container, (uint16_t)pos2, &type2);
                container_t *c =
                    container_lazy_ior(c1, type1, c2, type2, &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }

                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            // container_t *c2_clone = container_clone(c2, type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}